

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Execute<long,int,duckdb::ArgMinMaxState<long,int>>
               (ArgMinMaxState<long,_int> *state,long x_data,int y_data,AggregateBinaryInput *binary
               )

{
  bool bVar1;
  int *in_RCX;
  undefined4 in_EDX;
  ArgMinMaxState<long,_int> *in_RSI;
  undefined8 in_RDI;
  undefined1 x_null;
  int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  x_null = (undefined1)((ulong)in_RDI >> 0x38);
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    ((TemplatedValidityMask<unsigned_long> *)
                     CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(idx_t)in_RCX);
  if ((bVar1) && (bVar1 = LessThan::Operation<int>(in_RCX,in_stack_ffffffffffffffd8), bVar1)) {
    TemplatedValidityMask<unsigned_long>::RowIsValid
              ((TemplatedValidityMask<unsigned_long> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               (idx_t)in_RCX);
    Assign<long,int,duckdb::ArgMinMaxState<long,int>>
              (in_RSI,(long *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RCX,(bool)x_null);
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}